

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createSingleTest<vkt::api::(anonymous_namespace)::BufferView>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  string local_e8;
  RefBase<vk::Handle<(vk::HandleType)12>_> local_c8;
  Resources res;
  Environment env;
  
  Environment::Environment(&env,context,1);
  BufferView::Resources::Resources(&res,&env,&params);
  BufferView::create((Move<vk::Handle<(vk::HandleType)12>_> *)&local_c8,&env,&res,&params);
  local_e8.field_2._M_allocated_capacity = (size_type)local_c8.m_data.deleter.m_device;
  local_e8.field_2._8_8_ = local_c8.m_data.deleter.m_allocator;
  local_e8._M_dataplus._M_p = (pointer)local_c8.m_data.object.m_internal;
  local_e8._M_string_length = (size_type)local_c8.m_data.deleter.m_deviceIface;
  local_c8.m_data.object.m_internal = 0;
  local_c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase(&local_c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)12>_> *)&local_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"Ok",(allocator<char> *)&local_c8);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  BufferView::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 1u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}